

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.hpp
# Opt level: O0

bool __thiscall
trial::protocol::buffer::basic_string<char,_trial::protocol::buffer::base<char>_>::grow
          (basic_string<char,_trial::protocol::buffer::base<char>_> *this,size_type delta)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  size_type size;
  size_type delta_local;
  basic_string<char,_trial::protocol::buffer::base<char>_> *this_local;
  
  lVar1 = std::__cxx11::string::size();
  uVar3 = lVar1 + delta + 1;
  uVar2 = std::__cxx11::string::capacity();
  if (uVar2 < uVar3) {
    uVar2 = std::__cxx11::string::max_size();
    if (uVar2 < uVar3) {
      return false;
    }
    std::__cxx11::string::reserve((ulong)this->content);
  }
  return true;
}

Assistant:

virtual bool grow(size_type delta)
    {
        const size_type size = content.size() + delta + 1;
        if (size > content.capacity())
        {
            if (size > content.max_size())
                return false;
            content.reserve(size);
        }
        return true;
    }